

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.npatch.c
# Opt level: O0

void pnga_dot_patch(Integer g_a,char *t_a,Integer *alo,Integer *ahi,Integer g_b,char *t_b,
                   Integer *blo,Integer *bhi,void *retval)

{
  bool bVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  Integer grp;
  Integer IVar6;
  Integer IVar7;
  long lVar8;
  logical lVar9;
  Integer *in_RCX;
  Integer *in_RDX;
  char *in_RSI;
  Integer in_RDI;
  Integer in_R8;
  char *in_R9;
  Integer *in_stack_00000008;
  Integer *in_stack_00000010;
  char *in_stack_00000018;
  Integer last;
  Integer jtot;
  Integer offset;
  Integer lo [7];
  _iterator_hdl hdl_b;
  _iterator_hdl hdl_a;
  Integer b_grp;
  Integer a_grp;
  int local_sync_begin;
  char transp_b;
  char transp_a;
  char transp;
  char *tempname;
  Integer num_blocks_b;
  Integer num_blocks_a;
  Integer nproc;
  Integer temp_created;
  Integer me;
  float fsum;
  DoubleComplex csum;
  DoubleComplex zsum;
  double dsum;
  longlong llsum;
  long lsum;
  int alen;
  int isum;
  Integer btotal;
  Integer atotal;
  Integer ctype;
  char *B_ptr;
  char *A_ptr;
  Integer g_B;
  Integer g_A;
  Integer ldB [7];
  Integer hiB [7];
  Integer loB [7];
  Integer ldA [7];
  Integer hiA [7];
  Integer loA [7];
  Integer bdims [7];
  Integer bndim;
  Integer adims [7];
  Integer andim;
  Integer btype;
  Integer atype;
  Integer compatible;
  Integer j;
  Integer i;
  Integer *in_stack_fffffffffffff648;
  undefined4 *in_stack_fffffffffffff650;
  int iVar10;
  char *in_stack_fffffffffffff658;
  Integer in_stack_fffffffffffff660;
  int type;
  undefined4 in_stack_fffffffffffff668;
  undefined4 in_stack_fffffffffffff66c;
  Integer in_stack_fffffffffffff670;
  void *in_stack_fffffffffffff678;
  int scope;
  undefined6 in_stack_fffffffffffff688;
  undefined1 uVar11;
  undefined1 uVar12;
  char **in_stack_fffffffffffff690;
  Integer *in_stack_fffffffffffff698;
  Integer *in_stack_fffffffffffff6a0;
  long lVar13;
  _iterator_hdl *in_stack_fffffffffffff6a8;
  _iterator_hdl *in_stack_fffffffffffff718;
  Integer in_stack_fffffffffffff720;
  void *in_stack_fffffffffffff798;
  Integer *in_stack_fffffffffffff7a0;
  Integer *in_stack_fffffffffffff7a8;
  Integer *in_stack_fffffffffffff7b0;
  Integer in_stack_fffffffffffff7b8;
  Integer in_stack_fffffffffffff7c0;
  void *in_stack_fffffffffffff7d0;
  int *in_stack_fffffffffffff7d8;
  void *in_stack_fffffffffffff7e0;
  Integer in_stack_fffffffffffff7e8;
  char *in_stack_fffffffffffff7f0;
  Integer *in_stack_fffffffffffff858;
  Integer *in_stack_fffffffffffff860;
  Integer *in_stack_fffffffffffff868;
  Integer in_stack_fffffffffffff870;
  char *in_stack_fffffffffffff8c8;
  Integer *in_stack_fffffffffffff8d0;
  Integer in_stack_fffffffffffff8d8;
  Integer *in_stack_fffffffffffff958;
  Integer *in_stack_fffffffffffff960;
  Integer in_stack_fffffffffffff968;
  Integer in_stack_fffffffffffff970;
  Integer *in_stack_fffffffffffffa30;
  void *in_stack_fffffffffffffa38;
  Integer *in_stack_fffffffffffffa40;
  Integer *in_stack_fffffffffffffa48;
  Integer in_stack_fffffffffffffa50;
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined4 local_298;
  undefined4 local_294;
  long local_290;
  long local_288;
  undefined8 local_280;
  Integer *local_278;
  long local_270;
  Integer local_268;
  Integer local_260;
  Integer local_218 [8];
  Integer local_1d8 [8];
  long local_198 [8];
  Integer local_158 [8];
  Integer local_118 [8];
  long local_d8 [7];
  long local_a0;
  long local_98 [7];
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  char *local_30;
  Integer local_28;
  Integer *local_20;
  Integer *local_18;
  char *local_10;
  Integer local_8;
  
  local_38 = 0;
  local_40 = 0;
  local_48 = 0;
  local_50 = 0;
  local_58 = 0;
  local_60 = 0;
  local_a0 = 0;
  local_270 = 0;
  local_278 = (Integer *)0x0;
  local_280 = 0;
  local_288 = 0;
  local_290 = 0;
  local_294 = 0;
  local_298 = 0;
  local_2a0 = 0;
  local_2a8 = 0;
  local_2b0 = 0;
  local_268 = in_R8;
  local_260 = in_RDI;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(&local_2c0,0,0x10);
  memset(&local_2d0,0,0x10);
  pnga_nodeid();
  bVar1 = false;
  pnga_nnodes();
  iVar10 = _ga_sync_begin;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (iVar10 != 0) {
    pnga_sync();
  }
  grp = pnga_get_pgroup(local_8);
  IVar6 = pnga_get_pgroup(local_28);
  if (grp != IVar6) {
    pnga_error(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  }
  pnga_pgroup_nodeid(grp);
  pnga_inquire(in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860,
               in_stack_fffffffffffff858);
  pnga_inquire(in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860,
               in_stack_fffffffffffff858);
  if (local_50 != local_58) {
    pnga_error(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  }
  for (local_38 = 0; local_38 < local_60; local_38 = local_38 + 1) {
    if ((local_18[local_38] < 1) || (local_98[local_38] < local_20[local_38])) {
      pnga_error(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
    }
  }
  for (local_38 = 0; local_38 < local_a0; local_38 = local_38 + 1) {
    if ((in_stack_00000008[local_38] < 1) || (local_d8[local_38] < in_stack_00000010[local_38])) {
      pnga_error(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
    }
  }
  local_288 = 1;
  for (local_38 = 0; local_38 < local_60; local_38 = local_38 + 1) {
    local_288 = ((local_20[local_38] - local_18[local_38]) + 1) * local_288;
  }
  local_290 = 1;
  for (local_38 = 0; local_38 < local_a0; local_38 = local_38 + 1) {
    local_290 = ((in_stack_00000010[local_38] - in_stack_00000008[local_38]) + 1) * local_290;
  }
  if (local_288 != local_290) {
    pnga_error(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  }
  uVar12 = true;
  if (*local_10 != 'n') {
    uVar12 = *local_10 == 'N';
  }
  cVar2 = 't';
  if ((bool)uVar12 != false) {
    cVar2 = 'n';
  }
  uVar11 = true;
  if (*local_30 != 'n') {
    uVar11 = *local_30 == 'N';
  }
  cVar3 = 't';
  if ((bool)uVar11 != false) {
    cVar3 = 'n';
  }
  cVar4 = 't';
  if (cVar2 == cVar3) {
    cVar4 = 'n';
  }
  IVar6 = pnga_total_blocks(local_8);
  IVar7 = pnga_total_blocks(local_28);
  if (((-1 < IVar6) || (-1 < IVar7)) && ((cVar2 == 't' || (cVar3 == 't')))) {
    pnga_error(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  }
  local_294 = 0;
  local_2b0 = 0;
  local_2c0 = 0;
  local_2b8 = 0;
  local_2a0 = 0;
  local_2a8 = 0;
  local_2d0 = 0;
  local_2c8 = 0;
  lVar8 = local_50 + -0x3e9;
  switch(lVar8) {
  case 0:
    in_stack_00000018[0] = '\0';
    in_stack_00000018[1] = '\0';
    in_stack_00000018[2] = '\0';
    in_stack_00000018[3] = '\0';
    local_298 = 1;
    break;
  case 1:
    in_stack_00000018[0] = '\0';
    in_stack_00000018[1] = '\0';
    in_stack_00000018[2] = '\0';
    in_stack_00000018[3] = '\0';
    in_stack_00000018[4] = '\0';
    in_stack_00000018[5] = '\0';
    in_stack_00000018[6] = '\0';
    in_stack_00000018[7] = '\0';
    local_298 = 1;
    break;
  case 2:
    in_stack_00000018[0] = '\0';
    in_stack_00000018[1] = '\0';
    in_stack_00000018[2] = '\0';
    in_stack_00000018[3] = '\0';
    local_298 = 1;
    break;
  case 3:
    in_stack_00000018[0] = '\0';
    in_stack_00000018[1] = '\0';
    in_stack_00000018[2] = '\0';
    in_stack_00000018[3] = '\0';
    in_stack_00000018[4] = '\0';
    in_stack_00000018[5] = '\0';
    in_stack_00000018[6] = '\0';
    in_stack_00000018[7] = '\0';
    local_298 = 1;
    break;
  default:
    pnga_error(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
    break;
  case 5:
    in_stack_00000018[0] = '\0';
    in_stack_00000018[1] = '\0';
    in_stack_00000018[2] = '\0';
    in_stack_00000018[3] = '\0';
    in_stack_00000018[4] = '\0';
    in_stack_00000018[5] = '\0';
    in_stack_00000018[6] = '\0';
    in_stack_00000018[7] = '\0';
    local_298 = 2;
    break;
  case 6:
    in_stack_00000018[0] = '\0';
    in_stack_00000018[1] = '\0';
    in_stack_00000018[2] = '\0';
    in_stack_00000018[3] = '\0';
    in_stack_00000018[4] = '\0';
    in_stack_00000018[5] = '\0';
    in_stack_00000018[6] = '\0';
    in_stack_00000018[7] = '\0';
    in_stack_00000018[8] = '\0';
    in_stack_00000018[9] = '\0';
    in_stack_00000018[10] = '\0';
    in_stack_00000018[0xb] = '\0';
    in_stack_00000018[0xc] = '\0';
    in_stack_00000018[0xd] = '\0';
    in_stack_00000018[0xe] = '\0';
    in_stack_00000018[0xf] = '\0';
    local_298 = 2;
    break;
  case 0xf:
    in_stack_00000018[0] = '\0';
    in_stack_00000018[1] = '\0';
    in_stack_00000018[2] = '\0';
    in_stack_00000018[3] = '\0';
    in_stack_00000018[4] = '\0';
    in_stack_00000018[5] = '\0';
    in_stack_00000018[6] = '\0';
    in_stack_00000018[7] = '\0';
    local_298 = 1;
  }
  scope = (int)((ulong)lVar8 >> 0x20);
  iVar10 = (int)((ulong)in_stack_fffffffffffff650 >> 0x20);
  if ((IVar6 < 0) && (IVar7 < 0)) {
    pnga_distribution(in_stack_fffffffffffff970,in_stack_fffffffffffff968,in_stack_fffffffffffff960,
                      in_stack_fffffffffffff958);
    pnga_distribution(in_stack_fffffffffffff970,in_stack_fffffffffffff968,in_stack_fffffffffffff960,
                      in_stack_fffffffffffff958);
    lVar9 = pnga_comp_patch(local_60,local_118,local_158,local_a0,local_1d8,local_218);
    if ((lVar9 == 0) ||
       (lVar9 = pnga_comp_patch(local_60,local_18,local_20,local_a0,in_stack_00000008,
                                in_stack_00000010), lVar9 == 0)) {
      local_48 = 0;
    }
    else {
      local_48 = 1;
    }
    pnga_type_f2c(0x3f2);
    pnga_gop(in_stack_fffffffffffff670,
             (void *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668),
             in_stack_fffffffffffff660,in_stack_fffffffffffff658);
    type = (int)((ulong)in_stack_fffffffffffff660 >> 0x20);
    if ((local_48 == 0) || (cVar4 != 'n')) {
      lVar9 = pnga_duplicate(in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0,
                             in_stack_fffffffffffff8c8);
      if (lVar9 == 0) {
        pnga_error(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
      }
      in_stack_fffffffffffff648 = local_20;
      pnga_copy_patch((char *)hdl_b.count,hdl_b.hi[6],(Integer *)hdl_b.hi[5],(Integer *)hdl_b.hi[4],
                      hdl_b.hi[3],(Integer *)hdl_b.hi[2],hdl_b.proclist);
      local_a0 = local_60;
      bVar1 = true;
      pnga_distribution(in_stack_fffffffffffff970,in_stack_fffffffffffff968,
                        in_stack_fffffffffffff960,in_stack_fffffffffffff958);
    }
    lVar9 = pnga_comp_patch(local_60,local_118,local_158,local_a0,local_1d8,local_218);
    if (lVar9 == 0) {
      pnga_error(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
    }
    if (local_a0 < local_60) {
      local_60 = local_a0;
    }
    lVar9 = pnga_patch_intersect(local_18,local_20,local_118,local_158,local_60);
    if (lVar9 != 0) {
      pnga_access_ptr(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,
                      in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
      pnga_access_ptr(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,
                      in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
      iVar10 = (int)((ulong)&local_298 >> 0x20);
      in_stack_fffffffffffff648 = local_278;
      in_stack_fffffffffffff658 = in_stack_00000018;
      snga_dot_local_patch
                (in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0,
                 in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,in_stack_fffffffffffff798,
                 in_stack_fffffffffffff7d0,in_stack_fffffffffffff7d8,in_stack_fffffffffffff7e0);
      pnga_release(local_260,local_118,local_158);
      pnga_release(local_268,local_118,local_158);
    }
  }
  else {
    lVar9 = pnga_duplicate(in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0,
                           in_stack_fffffffffffff8c8);
    if (lVar9 == 0) {
      pnga_error(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
    }
    in_stack_fffffffffffff648 = local_20;
    pnga_copy_patch((char *)hdl_b.count,hdl_b.hi[6],(Integer *)hdl_b.hi[5],(Integer *)hdl_b.hi[4],
                    hdl_b.hi[3],(Integer *)hdl_b.hi[2],hdl_b.proclist);
    bVar1 = true;
    pnga_local_iterator_init(in_stack_fffffffffffff720,in_stack_fffffffffffff718);
    pnga_local_iterator_init(in_stack_fffffffffffff720,in_stack_fffffffffffff718);
    while( true ) {
      iVar5 = pnga_local_iterator_next
                        (in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0,
                         in_stack_fffffffffffff698,in_stack_fffffffffffff690,
                         (Integer *)CONCAT17(uVar12,CONCAT16(uVar11,in_stack_fffffffffffff688)));
      iVar10 = (int)((ulong)in_stack_fffffffffffff650 >> 0x20);
      scope = (int)((ulong)lVar8 >> 0x20);
      type = (int)((ulong)in_stack_fffffffffffff660 >> 0x20);
      if (iVar5 == 0) break;
      pnga_local_iterator_next
                (in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,
                 in_stack_fffffffffffff690,
                 (Integer *)CONCAT17(uVar12,CONCAT16(uVar11,in_stack_fffffffffffff688)));
      for (local_40 = 0; local_40 < local_60; local_40 = local_40 + 1) {
        *(Integer *)(&stack0xfffffffffffff6a8 + local_40 * 8) = local_118[local_40];
      }
      lVar9 = pnga_patch_intersect(local_18,local_20,local_118,local_158,local_60);
      if (lVar9 != 0) {
        lVar13 = 0;
        in_stack_fffffffffffff690 = (char **)(local_60 + -1);
        in_stack_fffffffffffff698 = (Integer *)0x1;
        for (local_40 = 0; local_40 < (long)in_stack_fffffffffffff690; local_40 = local_40 + 1) {
          lVar13 = (local_118[local_40] - *(long *)(&stack0xfffffffffffff6a8 + local_40 * 8)) *
                   (long)in_stack_fffffffffffff698 + lVar13;
          in_stack_fffffffffffff698 =
               (Integer *)(local_198[local_40] * (long)in_stack_fffffffffffff698);
        }
        in_stack_fffffffffffff6a0 =
             (Integer *)
             (lVar13 + (local_118[(long)in_stack_fffffffffffff690] -
                       *(long *)(&stack0xfffffffffffff6a8 + (long)in_stack_fffffffffffff690 * 8)) *
                       (long)in_stack_fffffffffffff698);
        in_stack_fffffffffffff678 = (void *)(local_50 + -0x3e9);
        switch(in_stack_fffffffffffff678) {
        case (void *)0x0:
          local_270 = local_270 + (long)in_stack_fffffffffffff6a0 * 4;
          local_278 = (Integer *)((long)local_278 + (long)in_stack_fffffffffffff6a0 * 4);
          break;
        case (void *)0x1:
          local_270 = local_270 + (long)in_stack_fffffffffffff6a0 * 8;
          local_278 = local_278 + (long)in_stack_fffffffffffff6a0;
          break;
        case (void *)0x2:
          local_270 = local_270 + (long)in_stack_fffffffffffff6a0 * 4;
          local_278 = (Integer *)((long)local_278 + (long)in_stack_fffffffffffff6a0 * 4);
          break;
        case (void *)0x3:
          local_270 = local_270 + (long)in_stack_fffffffffffff6a0 * 8;
          local_278 = local_278 + (long)in_stack_fffffffffffff6a0;
          break;
        case (void *)0x5:
          local_270 = local_270 + (long)in_stack_fffffffffffff6a0 * 8;
          local_278 = local_278 + (long)in_stack_fffffffffffff6a0;
          break;
        case (void *)0x6:
          local_270 = local_270 + (long)in_stack_fffffffffffff6a0 * 0x10;
          local_278 = local_278 + (long)in_stack_fffffffffffff6a0 * 2;
          break;
        case (void *)0xf:
          local_270 = local_270 + (long)in_stack_fffffffffffff6a0 * 8;
          local_278 = local_278 + (long)in_stack_fffffffffffff6a0;
        }
        in_stack_fffffffffffff650 = &local_298;
        in_stack_fffffffffffff648 = local_278;
        in_stack_fffffffffffff658 = in_stack_00000018;
        snga_dot_local_patch
                  (in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0,
                   in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,in_stack_fffffffffffff798,
                   in_stack_fffffffffffff7d0,in_stack_fffffffffffff7d8,in_stack_fffffffffffff7e0);
      }
    }
  }
  lVar8 = local_50 + -0x3e9;
  switch(lVar8) {
  case 0:
    local_280 = 0xffffffffffffff9d;
    break;
  case 1:
    local_280 = 0xffffffffffffff9b;
    break;
  case 2:
    local_280 = 0xfffffffffffffece;
    break;
  case 3:
    local_280 = 0xfffffffffffffecd;
    break;
  default:
    pnga_error(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
    break;
  case 5:
    local_280 = 0xfffffffffffffece;
    break;
  case 6:
    local_280 = 0xfffffffffffffecd;
    break;
  case 0xf:
    local_280 = 0xffffffffffffff9a;
  }
  iVar5 = (int)((ulong)lVar8 >> 0x20);
  lVar9 = pnga_is_mirrored(local_8);
  if ((lVar9 == 0) || (lVar9 = pnga_is_mirrored(local_28), lVar9 == 0)) {
    if (grp == -1) {
      armci_msg_gop_scope(scope,in_stack_fffffffffffff678,iVar5,
                          (char *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668),type
                         );
    }
    else {
      in_stack_fffffffffffff66c = (undefined4)local_280;
      in_stack_fffffffffffff668 = local_298;
      ga_get_armci_group_((int)grp);
      armci_msg_group_gop_scope
                (iVar5,(void *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668),
                 (int)((ulong)in_stack_00000018 >> 0x20),in_stack_fffffffffffff658,iVar10,
                 (ARMCI_Group *)in_stack_fffffffffffff648);
    }
  }
  else {
    armci_msg_gop_scope(scope,in_stack_fffffffffffff678,iVar5,
                        (char *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668),type);
  }
  if (bVar1) {
    pnga_destroy(CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
  }
  return;
}

Assistant:

void pnga_dot_patch(Integer g_a, char *t_a, Integer *alo, Integer *ahi, Integer g_b, char *t_b, Integer *blo, Integer *bhi, void *retval)
{
  Integer i=0, j=0;
  Integer compatible=0;
  Integer atype=0, btype=0, andim=0, adims[MAXDIM], bndim=0, bdims[MAXDIM];
  Integer loA[MAXDIM], hiA[MAXDIM], ldA[MAXDIM];
  Integer loB[MAXDIM], hiB[MAXDIM], ldB[MAXDIM];
  Integer g_A = g_a, g_B = g_b;
  char *A_ptr=NULL, *B_ptr=NULL;
  Integer ctype=0;
  Integer atotal=0, btotal=0;
  int isum=0, alen=0;
  long lsum=0;
  long long llsum=0;
  double dsum=0;
  DoubleComplex zsum={0,0};
  DoubleComplex csum={0,0};
  float fsum=0;
  Integer me= pnga_nodeid(), temp_created=0;
  Integer nproc = pnga_nnodes();
  Integer num_blocks_a=0, num_blocks_b=0;
  char *tempname = "temp", transp, transp_a, transp_b;
  int local_sync_begin=0;
  Integer a_grp=0, b_grp=0;
  _iterator_hdl hdl_a, hdl_b;

  local_sync_begin = _ga_sync_begin; 
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  a_grp = pnga_get_pgroup(g_a);
  b_grp = pnga_get_pgroup(g_b);
  if (a_grp != b_grp)
    pnga_error("Both arrays must be defined on same group",0L);
  me = pnga_pgroup_nodeid(a_grp);

  pnga_inquire(g_a, &atype, &andim, adims);
  pnga_inquire(g_b, &btype, &bndim, bdims);

  if(atype != btype ) pnga_error(" type mismatch ", 0L);

  /* check if patch indices and g_a dims match */
  for(i=0; i<andim; i++)
    if(alo[i] <= 0 || ahi[i] > adims[i])
      pnga_error("g_a indices out of range ", g_a);
  for(i=0; i<bndim; i++)
    if(blo[i] <= 0 || bhi[i] > bdims[i])
      pnga_error("g_b indices out of range ", g_b);

  /* check if numbers of elements in two patches match each other */
  atotal = 1; for(i=0; i<andim; i++) atotal *= (ahi[i] - alo[i] + 1);
  btotal = 1; for(i=0; i<bndim; i++) btotal *= (bhi[i] - blo[i] + 1);

  if(atotal != btotal)
    pnga_error("  capacities of patches do not match ", 0L);

  /* is transpose operation required ? */
  /* -- only if for one array transpose operation requested*/
  transp_a = (*t_a == 'n' || *t_a =='N')? 'n' : 't';
  transp_b = (*t_b == 'n' || *t_b =='N')? 'n' : 't';
  transp   = (transp_a == transp_b)? 'n' : 't';

  /* Find out if distribution is block-cyclic */
  num_blocks_a = pnga_total_blocks(g_a);
  num_blocks_b = pnga_total_blocks(g_b);

  if (num_blocks_a >= 0 || num_blocks_b >= 0) {
    if (transp_a == 't' || transp_b == 't')
      pnga_error("transpose not supported for block-cyclic data ", 0);
  }

  isum = 0; dsum = 0.; zsum.real = 0.; zsum.imag = 0.; fsum = 0;lsum=0;llsum=0;
  csum.real = 0.; csum.imag = 0.;
  
  switch (atype){
    case C_INT:
      *(int*)retval = isum;
      alen = 1;
      break;                                     
    case C_DCPL:
      ((double*)retval)[0] = zsum.real;
      ((double*)retval)[1] = zsum.imag;
      alen = 2;
      break;                                     
    case C_SCPL:
      ((float*)retval)[0] = csum.real;
      ((float*)retval)[1] = csum.imag;
      alen = 2;
      break;                                     
    case  C_DBL:
      *(double*)retval = dsum;
      alen = 1;
      break;                                     
    case  C_FLOAT:
      *(float*)retval = fsum;
      alen = 1;
      break;                                     
    case C_LONG:
      *(long*)retval = lsum;
      alen = 1;
      break;                                     
    case C_LONGLONG:
      *(long long*)retval = llsum;
      alen = 1;
      break;
     default:
        pnga_error("snga_dot_local_patch: type not supported",atype);
  }

  if (num_blocks_a < 0 && num_blocks_b < 0) {
    /* find out coordinates of patches of g_A and g_B that I own */
    pnga_distribution(g_A, me, loA, hiA);
    pnga_distribution(g_B, me, loB, hiB);

    if(pnga_comp_patch(andim, loA, hiA, bndim, loB, hiB) &&
        pnga_comp_patch(andim, alo, ahi, bndim, blo, bhi)) compatible = 1;
    else compatible = 0;
    /* pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "*"); */
    pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "&&");
    if(!(compatible && (transp=='n'))) {
      /* either patches or distributions do not match:
       *        - create a temp array that matches distribution of g_a
       *        - copy & reshape patch of g_b into g_B
       */
      if (!pnga_duplicate(g_a, &g_B, tempname))
        pnga_error("duplicate failed",0L);

      pnga_copy_patch(&transp, g_b, blo, bhi, g_B, alo, ahi);
      bndim = andim;
      temp_created = 1;
      pnga_distribution(g_B, me, loB, hiB);
    }

    if(!pnga_comp_patch(andim, loA, hiA, bndim, loB, hiB))
      pnga_error(" patches mismatch ",0);

    /* A[83:125,1:1]  <==> B[83:125] */
    if(andim > bndim) andim = bndim; /* need more work */

    /*  determine subsets of my patches to access  */
    if(pnga_patch_intersect(alo, ahi, loA, hiA, andim)){
      pnga_access_ptr(g_A, loA, hiA, &A_ptr, ldA);
      pnga_access_ptr(g_B, loA, hiA, &B_ptr, ldB);

      snga_dot_local_patch(atype, andim, loA, hiA, ldA, A_ptr, B_ptr,
          &alen, retval);
      /* release access to the data */
      pnga_release(g_A, loA, hiA);
      pnga_release(g_B, loA, hiA);
    }
  } else {
    /* Create copy of g_b identical with identical distribution as g_a */
    if (!pnga_duplicate(g_a, &g_B, tempname))
      pnga_error("duplicate failed",0L);
    pnga_copy_patch(&transp, g_b, blo, bhi, g_B, alo, ahi);
    temp_created = 1;

#if 1
    pnga_local_iterator_init(g_a, &hdl_a);
    pnga_local_iterator_init(g_B, &hdl_b);
    while(pnga_local_iterator_next(&hdl_a, loA, hiA, &A_ptr, ldA)) {
      Integer lo[MAXDIM]/*, hi[MAXDIM]*/;
      Integer offset, jtot, last;
      pnga_local_iterator_next(&hdl_b, loB, hiB, &B_ptr, ldB);
      /* make copies of loA and hiA since pnga_patch_intersect destroys
         original versions */
      for (j=0; j<andim; j++) {
        lo[j] = loA[j];
        /*hi[j] = hiA[j];*/
      }
      if(pnga_patch_intersect(alo, ahi, loA, hiA, andim)){
        /* evaluate offsets for system */
        offset = 0;
        last = andim-1;
        jtot = 1;
        for (j=0; j<last; j++) {
          offset += (loA[j] - lo[j])*jtot;
          jtot *= ldA[j];
        }
        offset += (loA[last]-lo[last])*jtot;

        /* offset pointers by correct amount */
        switch (atype){
          case C_INT:
            A_ptr = (void*)((int*)(A_ptr) + offset);
            B_ptr = (void*)((int*)(B_ptr) + offset);
            break;                                     
          case C_DCPL:
            A_ptr = (void*)((DoubleComplex*)(A_ptr) + offset);
            B_ptr = (void*)((DoubleComplex*)(B_ptr) + offset);
            break;                                     
          case C_SCPL:
            A_ptr = (void*)((SingleComplex*)(A_ptr) + offset);
            B_ptr = (void*)((SingleComplex*)(B_ptr) + offset);
            break;                                     
          case  C_DBL:
            A_ptr = (void*)((double*)(A_ptr) + offset);
            B_ptr = (void*)((double*)(B_ptr) + offset);
            break;                                     
          case  C_FLOAT:
            A_ptr = (void*)((float*)(A_ptr) + offset);
            B_ptr = (void*)((float*)(B_ptr) + offset);
            break;                                     
          case C_LONG:
            A_ptr = (void*)((long*)(A_ptr) + offset);
            B_ptr = (void*)((long*)(B_ptr) + offset);
            break;                                     
          case C_LONGLONG:
            A_ptr = (void*)((long long*)(A_ptr) + offset);
            B_ptr = (void*)((long long*)(B_ptr) + offset);
            break;                                     
        }
        snga_dot_local_patch(atype, andim, loA, hiA, ldA, A_ptr, B_ptr,
            &alen, retval);
      }
    }
#else
    /* If g_a regular distribution, then just use normal dot product on patch */
    if (num_blocks_a < 0) {
      /* find out coordinates of patches of g_A and g_B that I own */
      pnga_distribution(g_A, me, loA, hiA);
      pnga_distribution(g_B, me, loB, hiB);

      if(!pnga_comp_patch(andim, loA, hiA, bndim, loB, hiB))
        pnga_error(" patches mismatch ",0);

      /* A[83:125,1:1]  <==> B[83:125] */
      if(andim > bndim) andim = bndim; /* need more work */
      if(pnga_patch_intersect(alo, ahi, loA, hiA, andim)){
        pnga_access_ptr(g_A, loA, hiA, &A_ptr, ldA);
        pnga_access_ptr(g_B, loA, hiA, &B_ptr, ldB);

        snga_dot_local_patch(atype, andim, loA, hiA, ldA, A_ptr, B_ptr,
            &alen, retval);
        /* release access to the data */
        pnga_release(g_A, loA, hiA);
        pnga_release(g_B, loA, hiA);
      }
    } else {
      Integer lo[MAXDIM]/*, hi[MAXDIM]*/;
      Integer offset, jtot, last;
      /* simple block cyclic data distribution */
      if (!pnga_uses_proc_grid(g_a)) {
        for (i=me; i<num_blocks_a; i += nproc) {
          pnga_distribution(g_A, i, loA, hiA);
          /* make copies of loA and hiA since pnga_patch_intersect destroys
             original versions */
          for (j=0; j<andim; j++) {
            lo[j] = loA[j];
            /*hi[j] = hiA[j];*/
          }
          if(pnga_patch_intersect(alo, ahi, loA, hiA, andim)){
            pnga_access_block_ptr(g_A, i, &A_ptr, ldA);
            pnga_access_block_ptr(g_B, i, &B_ptr, ldB);

            /* evaluate offsets for system */
            offset = 0;
            last = andim-1;
            jtot = 1;
            for (j=0; j<last; j++) {
              offset += (loA[j] - lo[j])*jtot;
              jtot *= ldA[j];
            }
            offset += (loA[last]-lo[last])*jtot;

            /* offset pointers by correct amount */
            switch (atype){
              case C_INT:
                A_ptr = (void*)((int*)(A_ptr) + offset);
                B_ptr = (void*)((int*)(B_ptr) + offset);
                break;                                     
              case C_DCPL:
                A_ptr = (void*)((DoubleComplex*)(A_ptr) + offset);
                B_ptr = (void*)((DoubleComplex*)(B_ptr) + offset);
                break;                                     
              case C_SCPL:
                A_ptr = (void*)((SingleComplex*)(A_ptr) + offset);
                B_ptr = (void*)((SingleComplex*)(B_ptr) + offset);
                break;                                     
              case  C_DBL:
                A_ptr = (void*)((double*)(A_ptr) + offset);
                B_ptr = (void*)((double*)(B_ptr) + offset);
                break;                                     
              case  C_FLOAT:
                A_ptr = (void*)((float*)(A_ptr) + offset);
                B_ptr = (void*)((float*)(B_ptr) + offset);
                break;                                     
              case C_LONG:
                A_ptr = (void*)((long*)(A_ptr) + offset);
                B_ptr = (void*)((long*)(B_ptr) + offset);
                break;                                     
              case C_LONGLONG:
                A_ptr = (void*)((long long*)(A_ptr) + offset);
                B_ptr = (void*)((long long*)(B_ptr) + offset);
                break;                                     
            }
            snga_dot_local_patch(atype, andim, loA, hiA, ldA, A_ptr, B_ptr,
                &alen, retval);
            /* release access to the data */
            pnga_release_block(g_A, i);
            pnga_release_block(g_B, i);
          }
        }
      } else {
        /* Uses scalapack block-cyclic data distribution */
        Integer proc_index[MAXDIM], index[MAXDIM];
        Integer topology[MAXDIM]/*, chk*/;
        Integer blocks[MAXDIM], block_dims[MAXDIM];
        pnga_get_proc_index(g_a, me, proc_index);
        pnga_get_proc_index(g_a, me, index);
        pnga_get_block_info(g_a, blocks, block_dims);
        pnga_get_proc_grid(g_a, topology);
        while (index[andim-1] < blocks[andim-1]) {
          /* find bounding coordinates of block */
          /*chk = 1;*/
          for (i = 0; i < andim; i++) {
            loA[i] = index[i]*block_dims[i]+1;
            hiA[i] = (index[i] + 1)*block_dims[i];
            if (hiA[i] > adims[i]) hiA[i] = adims[i];
            /*if (hiA[i] < loA[i]) chk = 0;*/
          }
          /* make copies of loA and hiA since pnga_patch_intersect destroys
             original versions */
          for (j=0; j<andim; j++) {
            lo[j] = loA[j];
            /*hi[j] = hiA[j];*/
          }
          if(pnga_patch_intersect(alo, ahi, loA, hiA, andim)){
            pnga_access_block_grid_ptr(g_A, index, &A_ptr, ldA);
            pnga_access_block_grid_ptr(g_B, index, &B_ptr, ldB);

            /* evaluate offsets for system */
            offset = 0;
            last = andim-1;
            jtot = 1;
            for (j=0; j<last; j++) {
              offset += (loA[j] - lo[j])*jtot;
              jtot *= ldA[j];
            }
            offset += (loA[last]-lo[last])*jtot;

            /* offset pointers by correct amount */
            switch (atype){
              case C_INT:
                A_ptr = (void*)((int*)(A_ptr) + offset);
                B_ptr = (void*)((int*)(B_ptr) + offset);
                break;                                     
              case C_DCPL:
                A_ptr = (void*)((DoubleComplex*)(A_ptr) + offset);
                B_ptr = (void*)((DoubleComplex*)(B_ptr) + offset);
                break;                                     
              case C_SCPL:
                A_ptr = (void*)((SingleComplex*)(A_ptr) + offset);
                B_ptr = (void*)((SingleComplex*)(B_ptr) + offset);
                break;                                     
              case  C_DBL:
                A_ptr = (void*)((double*)(A_ptr) + offset);
                B_ptr = (void*)((double*)(B_ptr) + offset);
                break;                                     
              case  C_FLOAT:
                A_ptr = (void*)((float*)(A_ptr) + offset);
                B_ptr = (void*)((float*)(B_ptr) + offset);
                break;                                     
              case C_LONG:
                A_ptr = (void*)((long*)(A_ptr) + offset);
                B_ptr = (void*)((long*)(B_ptr) + offset);
                break;                                     
              case C_LONGLONG:
                A_ptr = (void*)((long long*)(A_ptr) + offset);
                B_ptr = (void*)((long long*)(B_ptr) + offset);
                break;                                     
            }
            snga_dot_local_patch(atype, andim, loA, hiA, ldA, A_ptr, B_ptr,
                &alen, retval);
            /* release access to the data */
            pnga_release_block_grid(g_A, index);
            pnga_release_block_grid(g_B, index);
          }

          /* increment index to get next block on processor */
          index[0] += topology[0];
          for (i = 0; i < andim; i++) {
            if (index[i] >= blocks[i] && i<andim-1) {
              index[i] = proc_index[i];
              index[i+1] += topology[i+1];
            }
          }
        }
      }
    }
#endif
  }

  /*convert from C data type to ARMCI type */
  switch(atype) {
    case C_FLOAT: ctype=ARMCI_FLOAT; break;
    case C_DBL: ctype=ARMCI_DOUBLE; break;
    case C_INT: ctype=ARMCI_INT; break;
    case C_LONG: ctype=ARMCI_LONG; break;
    case C_LONGLONG: ctype=ARMCI_LONG_LONG; break;
    case C_DCPL: ctype=ARMCI_DOUBLE; break;
    case C_SCPL: ctype=ARMCI_FLOAT; break;
    default: pnga_error("pnga_dot_patch: type not supported",atype);
  }

  if (pnga_is_mirrored(g_a) && pnga_is_mirrored(g_b)) {
    armci_msg_gop_scope(SCOPE_NODE,retval,alen,"+",ctype);
  } else {
    if (a_grp == -1) {
      armci_msg_gop_scope(SCOPE_ALL,retval,alen,"+",ctype);
#ifdef MSG_COMMS_MPI
    } else {
      armci_msg_group_gop_scope(SCOPE_ALL,retval,alen,"+",ctype,
          ga_get_armci_group_((int)a_grp));
#endif
    }
  }

  if(temp_created) pnga_destroy(g_B);
}